

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

ImGuiColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  int iVar1;
  ImGuiColumns *pIVar2;
  ulong uVar3;
  ImGuiColumns *in_RAX;
  ImGuiColumns *pIVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  ImGuiColumns IStack_a8;
  
  uVar7 = (ulong)(window->ColumnsStorage).Size;
  bVar10 = 0 < (long)uVar7;
  if ((0 < (long)uVar7) && (in_RAX = (window->ColumnsStorage).Data, in_RAX->ID != id)) {
    uVar3 = 1;
    do {
      uVar8 = uVar3;
      if (uVar7 == uVar8) {
        bVar10 = uVar8 < uVar7;
        goto LAB_0016dec0;
      }
      pIVar2 = in_RAX + 1;
      pIVar4 = in_RAX + 1;
      in_RAX = pIVar2;
      uVar3 = uVar8 + 1;
    } while (pIVar4->ID != id);
    bVar10 = uVar8 < uVar7;
  }
LAB_0016dec0:
  if (!bVar10) {
    ImGuiColumns::ImGuiColumns(&IStack_a8);
    iVar9 = (window->ColumnsStorage).Size;
    iVar1 = (window->ColumnsStorage).Capacity;
    if (iVar9 == iVar1) {
      iVar9 = iVar9 + 1;
      if (iVar1 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar1 / 2 + iVar1;
      }
      if (iVar9 < iVar6) {
        iVar9 = iVar6;
      }
      if (iVar1 < iVar9) {
        pIVar4 = (ImGuiColumns *)MemAlloc((long)iVar9 * 0x88);
        pIVar2 = (window->ColumnsStorage).Data;
        if (pIVar2 != (ImGuiColumns *)0x0) {
          memcpy(pIVar4,pIVar2,(long)(window->ColumnsStorage).Size * 0x88);
          MemFree((window->ColumnsStorage).Data);
        }
        (window->ColumnsStorage).Data = pIVar4;
        (window->ColumnsStorage).Capacity = iVar9;
      }
    }
    memcpy((window->ColumnsStorage).Data + (window->ColumnsStorage).Size,&IStack_a8,0x88);
    (window->ColumnsStorage).Size = (window->ColumnsStorage).Size + 1;
    ImDrawListSplitter::ClearFreeMemory(&IStack_a8.Splitter);
    if (IStack_a8.Splitter._Channels.Data != (ImDrawChannel *)0x0) {
      MemFree(IStack_a8.Splitter._Channels.Data);
    }
    if (IStack_a8.Columns.Data != (ImGuiColumnData *)0x0) {
      MemFree(IStack_a8.Columns.Data);
    }
    lVar5 = (long)(window->ColumnsStorage).Size;
    if (lVar5 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.h"
                    ,0x58d,"T &ImVector<ImGuiColumns>::back() [T = ImGuiColumns]");
    }
    in_RAX = (window->ColumnsStorage).Data + lVar5 + -1;
    in_RAX->ID = id;
  }
  return in_RAX;
}

Assistant:

ImGuiColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiColumns());
    ImGuiColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}